

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,4u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  short sVar6;
  uint uVar7;
  byte bVar8;
  ushort uVar9;
  uint recent;
  uint uVar10;
  ushort uVar11;
  bool bVar12;
  
  iVar4 = 0;
  bVar5 = 0;
  sVar6 = 0;
  bVar12 = false;
  uVar7 = 0;
  do {
    bVar8 = (bVar5 & 0xf) * '\x02';
    uVar1 = (ushort)uVar7 & 0xf;
    uVar10 = 0;
    uVar3 = uVar7;
    do {
      if (uVar10 < uVar7) {
        if ((int)uVar3 < 8 - bias) {
LAB_0010226c:
          uVar2 = (ushort)uVar10;
          uVar11 = uVar2 & 0x10 | uVar1;
          uVar9 = uVar2 & 0xf;
          if (uVar9 < uVar1) {
            if ((ushort)(8 - bias) <= (ushort)(uVar1 - uVar9)) {
              uVar11 = uVar11 - 0x10;
            }
          }
          else if ((ushort)(bias + 8) < (ushort)(uVar9 - uVar1)) {
            uVar11 = uVar11 + 0x10;
          }
          if (uVar11 != (ushort)uVar7) {
            return bVar12;
          }
          if ((bias == 0) &&
             ((ushort)(((bVar8 >> 4 & 1) * 0x10 + sVar6) - ((ushort)uVar3 & 0xf)) != uVar2)) {
            return bVar12;
          }
        }
      }
      else if ((int)(iVar4 + uVar10) <= bias + 8) goto LAB_0010226c;
      uVar10 = uVar10 + 1;
      bVar8 = bVar8 - 2;
      uVar3 = uVar3 - 1;
    } while (uVar10 != 0x20);
    bVar12 = 0x1e < uVar7;
    uVar7 = uVar7 + 1;
    sVar6 = sVar6 + 1;
    bVar5 = bVar5 + 1;
    iVar4 = iVar4 + -1;
    if (uVar7 == 0x20) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}